

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_opt.h
# Opt level: O2

float box_integral_improved(integral_image *iimage,int row,int col,int rows,int cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int _b;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  iVar1 = iimage->height;
  iVar2 = iimage->width;
  pfVar4 = iimage->data;
  iVar3 = iimage->data_width;
  fVar8 = 0.0;
  fVar9 = 0.0;
  iVar7 = row;
  if (iVar1 < row) {
    iVar7 = iVar1;
  }
  iVar5 = col;
  if (iVar2 < col) {
    iVar5 = iVar2;
  }
  iVar6 = rows + row;
  if (iVar1 <= rows + row) {
    iVar6 = iVar1;
  }
  iVar1 = cols + col;
  if (iVar2 <= cols + col) {
    iVar1 = iVar2;
  }
  if (0 < iVar5 && 0 < iVar7) {
    fVar9 = pfVar4[(iVar7 + -1) * iVar3 + iVar5 + -1];
  }
  if (0 < iVar1 && 0 < iVar7) {
    fVar8 = pfVar4[(iVar7 + -1) * iVar3 + iVar1 + -1];
  }
  fVar10 = 0.0;
  fVar11 = 0.0;
  if (0 < iVar6 && 0 < iVar5) {
    fVar11 = pfVar4[(iVar6 + -1) * iVar3 + iVar5 + -1];
  }
  if (0 < iVar1 && 0 < iVar6) {
    fVar10 = pfVar4[(iVar6 + -1) * iVar3 + iVar1 + -1];
  }
  return (fVar9 - fVar11) + (fVar10 - fVar8);
}

Assistant:

inline float box_integral_improved(struct integral_image *iimage, int row, int col, int rows, int cols) {
    float *data = (float *)iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;
    float temp0, temp1, res;

    // subtracting by one for row/col because row/col is inclusive.
    int r0 = MIN(row, height) - 1;         // r - 3
    int c0 = MIN(col, width) - 1;          // c - b - 1
    int r1 = MIN(row + rows, height) - 1;  // r - 3 + 5
    int c1 = MIN(col + cols, width) - 1;   // c - b + filter_size - 1

    // Example with 9x9 filter at (0,0)
    // A: (-3, -5)
    // B: (-3, 8)
    // C: (2, -1)
    // D: (2, 4)

    float A = 0.0f;
    float B = 0.0f;
    float C = 0.0f;
    float D = 0.0f;

    if (r0 >= 0 && c0 >= 0) {
        A = data[r0 * data_width + c0];
    }
    if (r0 >= 0 && c1 >= 0) {
        B = data[r0 * data_width + c1];
    }
    if (r1 >= 0 && c0 >= 0) {
        C = data[r1 * data_width + c0];
    }
    if (r1 >= 0 && c1 >= 0) {
        D = data[r1 * data_width + c1];
    }

    // there was a floating point arithmetic bug in the original implementation
    // this fixes it and now fmaxf is not needed
    // use this for validation:
    temp0 = A - C;
    temp1 = D - B;
    res = temp0 + temp1;
    
    return res;
}